

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

InstMeshInfo *
rw::ps2::getInstMeshInfo(InstMeshInfo *__return_storage_ptr__,MatPipeline *pipe,Geometry *g,Mesh *m)

{
  PipeAttribute *pPVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint local_30;
  uint local_2c;
  uint i_1;
  uint i;
  PipeAttribute *a;
  Mesh *m_local;
  Geometry *g_local;
  MatPipeline *pipe_local;
  
  __return_storage_ptr__->numAttribs = 0;
  __return_storage_ptr__->numBrokenAttribs = 0;
  __return_storage_ptr__->vertexSize = 0;
  for (local_2c = 0; local_2c < 10; local_2c = local_2c + 1) {
    pPVar1 = pipe->attribs[local_2c];
    if (pPVar1 != (PipeAttribute *)0x0) {
      if ((pPVar1->attrib & 6) == 0) {
        uVar2 = attribSize(pPVar1->attrib);
        __return_storage_ptr__->vertexSize = uVar2 + __return_storage_ptr__->vertexSize;
        __return_storage_ptr__->numAttribs = __return_storage_ptr__->numAttribs + 1;
      }
      else {
        __return_storage_ptr__->numBrokenAttribs = __return_storage_ptr__->numBrokenAttribs + 1;
      }
    }
  }
  if (g->meshHeader->flags == 1) {
    __return_storage_ptr__->numBatches = (m->numIndices - 2) / (pipe->triStripCount - 2);
    __return_storage_ptr__->batchVertCount = pipe->triStripCount;
    __return_storage_ptr__->lastBatchVertCount = (m->numIndices - 2) % (pipe->triStripCount - 2);
    if (__return_storage_ptr__->lastBatchVertCount != 0) {
      __return_storage_ptr__->numBatches = __return_storage_ptr__->numBatches + 1;
      __return_storage_ptr__->lastBatchVertCount = __return_storage_ptr__->lastBatchVertCount + 2;
    }
  }
  else {
    __return_storage_ptr__->numBatches =
         ((m->numIndices + pipe->triListCount) - 1) / pipe->triListCount;
    __return_storage_ptr__->batchVertCount = pipe->triListCount;
    __return_storage_ptr__->lastBatchVertCount = m->numIndices % pipe->triListCount;
  }
  if (__return_storage_ptr__->lastBatchVertCount == 0) {
    __return_storage_ptr__->lastBatchVertCount = __return_storage_ptr__->batchVertCount;
  }
  uVar2 = getBatchSize(pipe,__return_storage_ptr__->batchVertCount);
  __return_storage_ptr__->batchSize = uVar2;
  uVar2 = getBatchSize(pipe,__return_storage_ptr__->lastBatchVertCount);
  __return_storage_ptr__->lastBatchSize = uVar2;
  if (__return_storage_ptr__->numBrokenAttribs == 0) {
    __return_storage_ptr__->size =
         __return_storage_ptr__->batchSize * (__return_storage_ptr__->numBatches - 1) + 1 +
         __return_storage_ptr__->lastBatchSize;
  }
  else {
    __return_storage_ptr__->size =
         __return_storage_ptr__->numBrokenAttribs * 2 * __return_storage_ptr__->numBatches +
         (__return_storage_ptr__->batchSize + 1) * (__return_storage_ptr__->numBatches - 1) + 1 +
         __return_storage_ptr__->lastBatchSize;
  }
  __return_storage_ptr__->size2 = 0;
  for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
    pPVar1 = pipe->attribs[local_30];
    if ((pPVar1 != (PipeAttribute *)0x0) && ((pPVar1->attrib & 6) != 0)) {
      __return_storage_ptr__->attribPos[local_30] =
           __return_storage_ptr__->size2 + __return_storage_ptr__->size;
      uVar2 = m->numIndices;
      uVar3 = attribSize(pPVar1->attrib);
      __return_storage_ptr__->size2 = (uVar2 * uVar3 + 0xf >> 4) + __return_storage_ptr__->size2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

InstMeshInfo
getInstMeshInfo(MatPipeline *pipe, Geometry *g, Mesh *m)
{
	PipeAttribute *a;
	InstMeshInfo im;
	im.numAttribs = 0;
	im.numBrokenAttribs = 0;
	im.vertexSize = 0;
	for(uint i = 0; i < nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i])) {
			if(a->attrib & AT_RW)
				im.numBrokenAttribs++;
			else{
				im.vertexSize += attribSize(a->attrib);
				im.numAttribs++;
			}
		}
	if(g->meshHeader->flags == MeshHeader::TRISTRIP){
		im.numBatches = (m->numIndices-2) / (pipe->triStripCount-2);
		im.batchVertCount = pipe->triStripCount;
		im.lastBatchVertCount = (m->numIndices-2) % (pipe->triStripCount-2);
		if(im.lastBatchVertCount){
			im.numBatches++;
			im.lastBatchVertCount += 2;
		}
	}else{	// TRILIST; nothing else supported yet
		im.numBatches = (m->numIndices+pipe->triListCount-1) /
		                 pipe->triListCount;
		im.batchVertCount = pipe->triListCount;
		im.lastBatchVertCount = m->numIndices % pipe->triListCount;
	}
	if(im.lastBatchVertCount == 0)
		im.lastBatchVertCount = im.batchVertCount;

	im.batchSize = getBatchSize(pipe, im.batchVertCount);
	im.lastBatchSize = getBatchSize(pipe, im.lastBatchVertCount);
	if(im.numBrokenAttribs == 0)
		im.size = 1 + im.batchSize*(im.numBatches-1) + im.lastBatchSize;
	else
		im.size = 2*im.numBrokenAttribs*im.numBatches +
		          (1+im.batchSize)*(im.numBatches-1) + 1+im.lastBatchSize;

	/* figure out size and addresses of broken out sections */
	im.size2 = 0;
	for(uint i = 0; i < nelem(im.attribPos); i++)
		if((a = pipe->attribs[i]) && a->attrib & AT_RW){
			im.attribPos[i] = im.size2 + im.size;
			im.size2 += QWC(m->numIndices*attribSize(a->attrib));
		}

	return im;
}